

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Body::Body(Body *this,Point *p,PObject n)

{
  Body *local_18;
  
  (this->super_Object).position.x = 0;
  (this->super_Object).position.y = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_00107d08;
  (this->last).x = 0;
  (this->last).y = 0;
  (this->super_Object).ch = 'O';
  Point::operator=(&(this->super_Object).position,p);
  this->next = n;
  local_18 = this;
  std::vector<Object*,std::allocator<Object*>>::emplace_back<Object*>
            ((vector<Object*,std::allocator<Object*>> *)&Object::obj,(Object **)&local_18);
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Body::Body(const Point& p, PObject n){
	ch = CHR_BODY;
	position = p;
	next = n;
	obj.push_back(this);
	on_map = true;
}